

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EmptyTimingCheckArgSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::EmptyTimingCheckArgSyntax,slang::parsing::Token&>
          (BumpAllocator *this,Token *args)

{
  Token placeholder;
  EmptyTimingCheckArgSyntax *pEVar1;
  Info *in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pEVar1 = (EmptyTimingCheckArgSyntax *)allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8);
  placeholder.info = in_RSI;
  placeholder._0_8_ = in_RSI->location;
  slang::syntax::EmptyTimingCheckArgSyntax::EmptyTimingCheckArgSyntax
            ((EmptyTimingCheckArgSyntax *)in_RSI->rawTextPtr,placeholder);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }